

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathLangFunction(xmlXPathParserContextPtr ctxt,int nargs)

{
  uint uVar1;
  xmlXPathObjectPtr *ppxVar2;
  byte *pbVar3;
  int iVar4;
  __int32_t **pp_Var5;
  long lVar6;
  xmlXPathObjectPtr pxVar7;
  byte bVar8;
  xmlNodePtr node;
  uint uVar9;
  xmlChar *theLang;
  xmlChar *local_38;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  if (nargs != 1) {
    iVar4 = 0xc;
    goto LAB_001c03ea;
  }
  uVar9 = ctxt->valueNr;
  if ((int)uVar9 < 1) {
    iVar4 = 0x17;
    goto LAB_001c03ea;
  }
  if (ctxt->value != (xmlXPathObjectPtr)0x0) {
    if (ctxt->value->type == XPATH_STRING) {
LAB_001c0395:
      uVar1 = uVar9 - 1;
      ctxt->valueNr = uVar1;
      ppxVar2 = ctxt->valueTab;
      if (uVar9 == 1) {
        pxVar7 = (xmlXPathObjectPtr)0x0;
      }
      else {
        pxVar7 = ppxVar2[(ulong)uVar9 - 2];
      }
      ctxt->value = pxVar7;
      pxVar7 = ppxVar2[uVar1];
      ppxVar2[uVar1] = (xmlXPathObjectPtr)0x0;
    }
    else {
      xmlXPathStringFunction(ctxt,1);
      if ((ctxt->value == (xmlXPathObjectPtr)0x0) || (ctxt->value->type != XPATH_STRING))
      goto LAB_001c03e2;
      uVar9 = ctxt->valueNr;
      if (0 < (int)uVar9) goto LAB_001c0395;
      pxVar7 = (xmlXPathObjectPtr)0x0;
    }
    node = ctxt->context->node;
    uVar9 = 0;
    if (node != (xmlNodePtr)0x0) {
      pbVar3 = pxVar7->stringval;
      do {
        iVar4 = xmlNodeGetAttrValue(node,"lang",(xmlChar *)"http://www.w3.org/XML/1998/namespace",
                                    &local_38);
        if (iVar4 < 0) {
          xmlXPathPErrMemory(ctxt);
        }
        if (local_38 != (xmlChar *)0x0) {
          if (pbVar3 == (byte *)0x0) {
            uVar9 = 0;
            goto LAB_001c04dd;
          }
          bVar8 = *pbVar3;
          if (bVar8 != 0) {
            pp_Var5 = __ctype_toupper_loc();
            uVar9 = 0;
            lVar6 = 0;
            goto LAB_001c04a2;
          }
          lVar6 = 0;
          goto LAB_001c04c9;
        }
        node = node->parent;
      } while (node != (_xmlNode *)0x0);
      uVar9 = 0;
    }
LAB_001c04ed:
    xmlXPathReleaseObject(ctxt->context,pxVar7);
    pxVar7 = xmlXPathCacheNewBoolean(ctxt,uVar9);
    xmlXPathValuePush(ctxt,pxVar7);
    return;
  }
LAB_001c03e2:
  iVar4 = 0xb;
LAB_001c03ea:
  xmlXPathErr(ctxt,iVar4);
  return;
  while( true ) {
    bVar8 = pbVar3[lVar6 + 1];
    lVar6 = lVar6 + 1;
    if (bVar8 == 0) break;
LAB_001c04a2:
    if ((*pp_Var5)[bVar8] != (*pp_Var5)[local_38[lVar6]]) goto LAB_001c04dd;
  }
LAB_001c04c9:
  uVar9 = (uint)(local_38[lVar6] == '-' || local_38[lVar6] == '\0');
LAB_001c04dd:
  (*xmlFree)(local_38);
  goto LAB_001c04ed;
}

Assistant:

void
xmlXPathLangFunction(xmlXPathParserContextPtr ctxt, int nargs) {
    xmlXPathObjectPtr val;
    xmlNodePtr cur;
    xmlChar *theLang;
    const xmlChar *lang;
    int ret = 0;
    int i;

    CHECK_ARITY(1);
    CAST_TO_STRING;
    CHECK_TYPE(XPATH_STRING);
    val = xmlXPathValuePop(ctxt);
    lang = val->stringval;
    cur = ctxt->context->node;
    while (cur != NULL) {
        if (xmlNodeGetAttrValue(cur, BAD_CAST "lang", XML_XML_NAMESPACE,
                                &theLang) < 0)
            xmlXPathPErrMemory(ctxt);
        if (theLang != NULL)
            break;
        cur = cur->parent;
    }
    if ((theLang != NULL) && (lang != NULL)) {
        for (i = 0;lang[i] != 0;i++)
            if (toupper(lang[i]) != toupper(theLang[i]))
                goto not_equal;
        if ((theLang[i] == 0) || (theLang[i] == '-'))
            ret = 1;
    }
not_equal:
    if (theLang != NULL)
	xmlFree((void *)theLang);

    xmlXPathReleaseObject(ctxt->context, val);
    xmlXPathValuePush(ctxt, xmlXPathCacheNewBoolean(ctxt, ret));
}